

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManVerifyUsingTerSim
               (Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,Vec_Int_t *vObjs,Vec_Int_t *vRes)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int local_5c;
  
  uVar16 = 0xbfffffffbfffffff;
  local_5c = pCex->nRegs;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  if (-1 < pCex->iFrame) {
    iVar4 = 0;
    do {
      if (0 < vMap->nSize) {
        lVar12 = 0;
        do {
          iVar2 = vMap->pArray[lVar12];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00573d48;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar2;
          uVar8 = local_5c + (int)lVar12;
          uVar8 = (uint)(((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0);
          pGVar5->Value = uVar8;
          uVar14 = *(ulong *)pGVar5;
          if ((((uint)uVar14 & 0x9fffffff) == 0x9fffffff) &&
             ((int)((uint)(uVar14 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
            if (uVar8 == 0) {
              uVar14 = uVar14 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar14 = uVar14 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          else {
            uVar14 = uVar14 | 0x4000000040000000;
          }
          *(ulong *)pGVar5 = uVar14;
          lVar12 = lVar12 + 1;
        } while (lVar12 < vMap->nSize);
      }
      if (0 < vRes->nSize) {
        lVar12 = 0;
        do {
          lVar13 = (long)vRes->pArray[lVar12];
          if ((lVar13 < 0) || (p->nObjs <= vRes->pArray[lVar12])) goto LAB_00573d48;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          uVar14 = 0x4000000000000000;
          if (pGVar5[lVar13].Value == 0) {
            uVar14 = 0x40000000;
          }
          *(ulong *)(pGVar5 + lVar13) = uVar14 | *(ulong *)(pGVar5 + lVar13) & 0xbfffffffbfffffff;
          lVar12 = lVar12 + 1;
        } while (lVar12 < vRes->nSize);
      }
      if (0 < vObjs->nSize) {
        lVar12 = 0;
        do {
          iVar2 = vObjs->pArray[lVar12];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00573d48;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar5 + iVar2;
          uVar14 = *(ulong *)pGVar1;
          uVar8 = (uint)uVar14;
          uVar11 = uVar14 & 0x1fffffff;
          uVar15 = uVar16;
          if (uVar11 == 0x1fffffff || -1 < (int)uVar8) {
            uVar10 = (uint)(uVar14 >> 0x20);
            if ((int)uVar8 < 0 || (int)uVar11 == 0x1fffffff) {
              if (iVar4 != 0) {
                if ((uVar8 & 0x9fffffff) != 0x9fffffff) {
LAB_00573d86:
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar10 = uVar10 & 0x1fffffff;
                iVar2 = p->vCis->nSize;
                if ((int)uVar10 < iVar2 - p->nRegs) goto LAB_00573d86;
                iVar3 = p->vCos->nSize;
                uVar10 = (iVar3 - iVar2) + uVar10;
                if ((-1 < (int)uVar10) && ((int)uVar10 < iVar3)) {
                  iVar2 = p->vCos->pArray[uVar10];
                  lVar13 = (long)iVar2;
                  if ((-1 < lVar13) && (iVar2 < p->nObjs)) {
                    if ((*(ulong *)(pGVar5 + lVar13) & 0x4000000040000000) == 0) {
                      __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                    ,0x340,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    uVar15 = *(ulong *)(pGVar5 + lVar13) & 0x40000000;
                    *(ulong *)pGVar1 = uVar14 & 0xffffffffbfffffff | uVar15;
                    uVar14 = uVar14 & 0xbfffffffbfffffff | uVar15 |
                             *(ulong *)(pGVar5 + lVar13) & 0x4000000000000000;
                    goto LAB_00573bf2;
                  }
                  goto LAB_00573d48;
                }
                goto LAB_00573de3;
              }
            }
            else {
              uVar15 = *(ulong *)(pGVar1 + -uVar11) & 0x4000000040000000;
              if (uVar15 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x328,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              uVar11 = *(ulong *)(pGVar1 + -(ulong)(uVar10 & 0x1fffffff)) & 0x4000000040000000;
              if (uVar11 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x329,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
              }
              if ((((((uVar8 >> 0x1d & 1) == 0) || (uVar15 != 0x4000000000000000)) &&
                   (((uVar8 >> 0x1d & 1) != 0 || (uVar15 != 0x40000000)))) &&
                  (((uVar14 >> 0x3d & 1) == 0 || (uVar11 != 0x4000000000000000)))) &&
                 (((uVar14 >> 0x3d & 1) != 0 || (uVar11 != 0x40000000)))) {
                if ((((byte)(uVar14 >> 0x1d) & 1 & uVar15 == 0x40000000) != 0) ||
                   ((uVar14 >> 0x1d & 1) == 0 && uVar15 == 0x4000000000000000)) {
                  bVar9 = (byte)(uVar14 >> 0x3d) & 1;
                  if (((bVar9 & uVar11 == 0x40000000) != 0) ||
                     (bVar9 == 0 && uVar11 == 0x4000000000000000)) {
                    uVar14 = uVar14 & 0xbfffffff3fffffff;
                    goto LAB_00573c0a;
                  }
                }
                goto LAB_00573a5c;
              }
              uVar15 = 0xbfffffff3fffffff;
            }
LAB_00573beb:
            uVar14 = uVar14 & uVar15 | 0x40000000;
          }
          else {
            uVar11 = *(ulong *)(pGVar1 + -uVar11) & 0x4000000040000000;
            if (uVar11 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x334,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
            }
            if ((((uVar8 >> 0x1d & 1) != 0) && (uVar11 == 0x4000000000000000)) ||
               (((uVar8 >> 0x1d & 1) == 0 && (uVar11 == 0x40000000)))) goto LAB_00573beb;
            if ((((byte)(uVar14 >> 0x1d) & 1 & uVar11 == 0x40000000) == 0) &&
               ((uVar14 >> 0x1d & 1) != 0 || uVar11 != 0x4000000000000000)) {
LAB_00573a5c:
              uVar14 = uVar14 | 0x4000000040000000;
            }
            else {
              uVar14 = uVar14 & 0xbfffffffbfffffff;
LAB_00573c0a:
              uVar14 = uVar14 | 0x4000000000000000;
            }
          }
LAB_00573bf2:
          *(ulong *)pGVar1 = uVar14;
          lVar12 = lVar12 + 1;
        } while (lVar12 < vObjs->nSize);
      }
      local_5c = local_5c + pCex->nPis;
      bVar7 = iVar4 < pCex->iFrame;
      iVar4 = iVar4 + 1;
    } while (bVar7);
  }
  iVar4 = vMap->nSize;
  if (0 < (long)iVar4) {
    piVar6 = vMap->pArray;
    lVar12 = 0;
    do {
      iVar2 = piVar6[lVar12];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00573d48;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar2].Value = 0;
      lVar12 = lVar12 + 1;
    } while (iVar4 != lVar12);
  }
  iVar4 = p->vCos->nSize;
  if (iVar4 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar4 < 1) {
LAB_00573de3:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *p->vCos->pArray;
  if ((-1 < (long)iVar4) && (iVar4 < p->nObjs)) {
    if (((undefined1  [12])p->pObjs[iVar4] & (undefined1  [12])0x4000000040000000) !=
        (undefined1  [12])0x4000000000000000) {
      Abc_Print((int)p,"\nRefinement verification has failed!!!\n");
      return;
    }
    return;
  }
LAB_00573d48:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Rnm_ManVerifyUsingTerSim( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, Vec_Int_t * vObjs, Vec_Int_t * vRes )
{
    Gia_Obj_t * pObj;
    int i, f, iBit = pCex->nRegs;
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    for ( f = 0; f <= pCex->iFrame; f++, iBit += pCex->nPis )
    {
        Gia_ManForEachObjVec( vMap, p, pObj, i )
        {
            pObj->Value = Abc_InfoHasBit( pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p, pObj) )
                Gia_ObjTerSimSetX( pObj );
            else if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vRes, p, pObj, i ) // vRes is subset of vMap
        {
            if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vObjs, p, pObj, i )
        {
            if ( Gia_ObjIsCo(pObj) )
                Gia_ObjTerSimCo( pObj );
            else if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjTerSimAnd( pObj );
            else if ( f == 0 )
                Gia_ObjTerSimSet0( pObj );
            else
                Gia_ObjTerSimRo( p, pObj );
        }
    }
    Gia_ManForEachObjVec( vMap, p, pObj, i )
        pObj->Value = 0;
    pObj = Gia_ManPo( p, 0 );
    if ( !Gia_ObjTerSimGet1(pObj) )
        Abc_Print( 1, "\nRefinement verification has failed!!!\n" );
}